

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::RsCodeBlockSyntax::getChild(RsCodeBlockSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  TokenOrSyntax *in_stack_ffffffffffffffa0;
  nullptr_t in_stack_ffffffffffffffa8;
  
  if (in_RDX == 0) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffa8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,token);
  }
  else if (in_RDX == 1) {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x28),in_stack_ffffffffffffff98);
  }
  else if (in_RDX == 2) {
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffffa8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffa0,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffffa8);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax RsCodeBlockSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openBrace;
        case 1: return &items;
        case 2: return closeBrace;
        default: return nullptr;
    }
}